

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O2

exr_result_t default_read_chunk(exr_decode_pipeline_t *decode)

{
  exr_result_t eVar1;
  long lVar2;
  void *packed_data;
  int part_index;
  exr_const_context_t p_Var3;
  void *sample_data;
  
  p_Var3 = decode->context;
  if (p_Var3 == (exr_const_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    if (*p_Var3 != (_priv_exr_context_t)0x0) {
      eVar1 = (**(code **)(p_Var3 + 0x38))(p_Var3,7);
      return eVar1;
    }
    lVar2 = (long)decode->part_index;
    if ((lVar2 < 0) || (*(int *)(p_Var3 + 0xc4) <= decode->part_index)) {
      eVar1 = (**(code **)(p_Var3 + 0x48))
                        (p_Var3,4,"Part index (%d) out of range",lVar2,*(code **)(p_Var3 + 0x48));
      return eVar1;
    }
    lVar2 = *(long *)(*(long *)(p_Var3 + 0x1d8) + lVar2 * 8);
    if ((decode->unpacked_buffer == decode->packed_buffer) && (decode->unpacked_alloc_size == 0)) {
      decode->unpacked_buffer = (void *)0x0;
    }
    if ((*(uint *)(lVar2 + 4) & 0xfffffffe) == 2) {
      eVar1 = internal_decode_alloc_buffer
                        (decode,EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,
                         &decode->packed_sample_count_table,&decode->packed_sample_count_alloc_size,
                         (decode->chunk).sample_count_table_size);
      if (eVar1 == 0) {
        if ((decode->decode_flags & 4) == 0) {
          eVar1 = internal_decode_alloc_buffer
                            (decode,EXR_TRANSCODE_BUFFER_PACKED,&decode->packed_buffer,
                             &decode->packed_alloc_size,(decode->chunk).packed_size);
          if (eVar1 != 0) {
            return eVar1;
          }
          p_Var3 = decode->context;
          part_index = decode->part_index;
          packed_data = decode->packed_buffer;
          sample_data = decode->packed_sample_count_table;
        }
        else {
          p_Var3 = decode->context;
          part_index = decode->part_index;
          sample_data = decode->packed_sample_count_table;
          packed_data = (void *)0x0;
        }
        eVar1 = exr_read_deep_chunk(p_Var3,part_index,&decode->chunk,packed_data,sample_data);
        return eVar1;
      }
    }
    else {
      eVar1 = internal_decode_alloc_buffer
                        (decode,EXR_TRANSCODE_BUFFER_PACKED,&decode->packed_buffer,
                         &decode->packed_alloc_size,(decode->chunk).packed_size);
      if (eVar1 == 0) {
        eVar1 = exr_read_chunk(decode->context,decode->part_index,&decode->chunk,
                               decode->packed_buffer);
        return eVar1;
      }
    }
  }
  return eVar1;
}

Assistant:

static exr_result_t
default_read_chunk (exr_decode_pipeline_t* decode)
{
    exr_result_t rv;
    EXR_PROMOTE_READ_CONST_CONTEXT_AND_PART_OR_ERROR (
        decode->context, decode->part_index);

    if (decode->unpacked_buffer == decode->packed_buffer &&
        decode->unpacked_alloc_size == 0)
        decode->unpacked_buffer = NULL;

    if (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        rv = internal_decode_alloc_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,
            &(decode->packed_sample_count_table),
            &(decode->packed_sample_count_alloc_size),
            decode->chunk.sample_count_table_size);
        if (rv != EXR_ERR_SUCCESS) return rv;

        if ((decode->decode_flags & EXR_DECODE_SAMPLE_DATA_ONLY))
        {
            rv = exr_read_deep_chunk (
                decode->context,
                decode->part_index,
                &(decode->chunk),
                NULL,
                decode->packed_sample_count_table);
        }
        else
        {
            rv = internal_decode_alloc_buffer (
                decode,
                EXR_TRANSCODE_BUFFER_PACKED,
                (void**) &(decode->packed_buffer),
                &(decode->packed_alloc_size),
                decode->chunk.packed_size);
            if (rv != EXR_ERR_SUCCESS) return rv;

            rv = exr_read_deep_chunk (
                decode->context,
                decode->part_index,
                &(decode->chunk),
                decode->packed_buffer,
                decode->packed_sample_count_table);
        }
    }
    else
    {
        rv = internal_decode_alloc_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_PACKED,
            (void**) &(decode->packed_buffer),
            &(decode->packed_alloc_size),
            decode->chunk.packed_size);
        if (rv != EXR_ERR_SUCCESS) return rv;
        rv = exr_read_chunk (
            decode->context,
            decode->part_index,
            &(decode->chunk),
            decode->packed_buffer);
    }

    return rv;
}